

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O1

void crc_init(void)

{
  long lVar1;
  uint uVar2;
  
  crc_table[0] = 0;
  crc_table[1] = 0x864cfb;
  lVar1 = 1;
  do {
    uVar2 = crc_table[lVar1] * 2;
    if ((crc_table[lVar1] >> 0x17 & 1) == 0) {
      crc_table[lVar1 * 2] = uVar2;
      uVar2 = uVar2 ^ 0x864cfb;
    }
    else {
      crc_table[lVar1 * 2] = uVar2 ^ 0x864cfb;
    }
    crc_table[lVar1 * 2 + 1] = uVar2;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 0x80);
  return;
}

Assistant:

void
crc_init(void)
{
	int i;
	unsigned int t, *p, *q;
	unsigned int poly = 0x864CFB;

	p = q = crc_table;
	*q++ = 0;
	*q++ = poly;

	for (i = 1; i < 128; i++) {
		t = *(++p);
		if (t & 0x800000) {
			t <<= 1;
			*q++ = t ^ poly;
			*q++ = t;
		}
		else {
			t <<= 1;
			*q++ = t;
			*q++ = t ^ poly;
		}
	}
}